

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void small_suite::run(void)

{
  test_zero();
  test_one();
  test_minus_one();
  test_lower();
  test_upper();
  fail_empty();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_minus_one();
    test_lower();
    test_upper();
    fail_empty();
}